

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void load256u64(uint16_t *out,uint64_t v,int is_signed)

{
  uint16_t *puVar1;
  long lVar2;
  
  puVar1 = out;
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 0x10) {
    *puVar1 = (uint16_t)(v >> ((byte)lVar2 & 0x3f));
    puVar1 = puVar1 + 1;
  }
  for (lVar2 = 4; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    out[lVar2] = -(ushort)(is_signed != 0 && (long)v < 0);
  }
  return;
}

Assistant:

static void load256u64(uint16_t* out, uint64_t v, int is_signed) {
    int i;
    uint64_t sign = is_signed && (v >> 63) ? UINT64_MAX : 0;
    for (i = 0; i < 4; ++i) {
        out[i] = v >> (16 * i);
    }
    for (i = 4; i < 16; ++i) {
        out[i] = sign;
    }
}